

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpDisassemble::OnBrTableExpr
          (BinaryReaderObjdumpDisassemble *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  Offset OVar1;
  Offset OVar2;
  char *pcVar3;
  undefined8 uVar4;
  __cxx11 local_a0 [32];
  __cxx11 local_80 [36];
  uint local_5c;
  string local_58 [4];
  Index i;
  string buffer;
  Offset immediate_len;
  Index default_target_depth_local;
  Index *target_depths_local;
  Index num_targets_local;
  BinaryReaderObjdumpDisassemble *this_local;
  
  OVar1 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
          state)->offset;
  OVar2 = this->current_opcode_offset;
  std::__cxx11::string::string(local_58);
  for (local_5c = 0; local_5c < num_targets; local_5c = local_5c + 1) {
    std::__cxx11::to_string(local_80,target_depths[local_5c]);
    pcVar3 = (char *)std::__cxx11::string::append(local_58);
    std::__cxx11::string::append(pcVar3);
    std::__cxx11::string::~string((string *)local_80);
  }
  std::__cxx11::to_string(local_a0,default_target_depth);
  std::__cxx11::string::append(local_58);
  std::__cxx11::string::~string((string *)local_a0);
  uVar4 = std::__cxx11::string::c_str();
  LogOpcode(this,OVar1 - OVar2,"%s",uVar4);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::__cxx11::string::~string(local_58);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnBrTableExpr(
    Index num_targets,
    Index* target_depths,
    Index default_target_depth) {
  Offset immediate_len = state->offset - current_opcode_offset;

  std::string buffer = std::string();
  for (Index i = 0; i < num_targets; i++) {
    buffer.append(std::to_string(target_depths[i])).append(" ");
  }
  buffer.append(std::to_string(default_target_depth));

  LogOpcode(immediate_len, "%s", buffer.c_str());
  return Result::Ok;
}